

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *
__thiscall Parser::parseCallArgumentList_abi_cxx11_(Parser *this)

{
  Tokenizer *in_RSI;
  allocator<char> *in_RDI;
  shared_ptr<ExpressionNode> arg;
  Token token;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  *arguments;
  Token *in_stack_fffffffffffffea8;
  Token *in_stack_fffffffffffffeb0;
  Token *in_stack_fffffffffffffeb8;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  *in_stack_fffffffffffffec0;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *this_00;
  allocator<char> *__s;
  allocator<char> local_f9;
  string local_f8 [16];
  Parser *in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff30;
  TokenType in_stack_ffffffffffffff3c;
  Parser *in_stack_ffffffffffffff40;
  int local_80;
  Tokenizer *in_stack_ffffffffffffff98;
  allocator<char> local_31;
  string local_30 [48];
  
  __s = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,(char *)__s
             ,in_RDI);
  expectToken(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  std::__cxx11::
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::list
            ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)0x16e441);
  Tokenizer::peek(in_RSI);
  Token::Token(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (local_80 != 0x2a) {
    parseCallArgument(in_stack_ffffffffffffff18);
    std::__cxx11::
    list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
    push_back(in_stack_fffffffffffffec0,(value_type *)in_stack_fffffffffffffeb8);
    Tokenizer::peek(in_RSI);
    Token::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    while (local_80 == 0x2f) {
      Tokenizer::nextToken(in_stack_ffffffffffffff98);
      Token::~Token((Token *)0x16e4f2);
      parseCallArgument(in_stack_ffffffffffffff18);
      this_00 = (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                 *)&stack0xffffffffffffff28;
      std::shared_ptr<ExpressionNode>::operator=
                ((shared_ptr<ExpressionNode> *)in_stack_fffffffffffffeb0,
                 (shared_ptr<ExpressionNode> *)in_stack_fffffffffffffea8);
      std::shared_ptr<ExpressionNode>::~shared_ptr((shared_ptr<ExpressionNode> *)0x16e52f);
      std::__cxx11::
      list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
      push_back(this_00,(value_type *)in_stack_fffffffffffffeb8);
      in_stack_fffffffffffffeb8 = Tokenizer::peek(in_RSI);
      Token::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
    std::shared_ptr<ExpressionNode>::~shared_ptr((shared_ptr<ExpressionNode> *)0x16e618);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,(char *)__s
             ,in_RDI);
  expectToken(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  Token::~Token((Token *)0x16e67e);
  return (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *
         )__s;
}

Assistant:

std::list<std::shared_ptr<ExpressionNode>> Parser::parseCallArgumentList()
{
  expectToken(TokenType::LParen, "Expected open parenthesis!");
  std::list<std::shared_ptr<ExpressionNode>> arguments{};
  auto token = tokenizer_.peek();
  if(token.type != TokenType::RParen)
  {
    auto arg = parseCallArgument();
    arguments.push_back(std::move(arg));
    token = tokenizer_.peek();
    while(token.type == TokenType::Comma)
    {
      tokenizer_.nextToken();
      arg = parseCallArgument();
      arguments.push_back(std::move(arg));
      token = tokenizer_.peek();
    }
  }
  expectToken(TokenType::RParen, "Expected closing parenthesis!");

  return arguments;
}